

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void lyxml_free_withsiblings(ly_ctx *ctx,lyxml_elem *elem)

{
  lyxml_elem *plVar1;
  lyxml_elem *aux;
  lyxml_elem *iter;
  lyxml_elem *elem_local;
  ly_ctx *ctx_local;
  
  if (elem != (lyxml_elem *)0x0) {
    aux = elem->prev;
    while (plVar1 = elem, aux->next != (lyxml_elem *)0x0) {
      plVar1 = aux->prev;
      lyxml_free(ctx,aux);
      aux = plVar1;
    }
    while (aux = plVar1, aux != (lyxml_elem *)0x0) {
      plVar1 = aux->next;
      lyxml_free(ctx,aux);
    }
  }
  return;
}

Assistant:

API void
lyxml_free_withsiblings(struct ly_ctx *ctx, struct lyxml_elem *elem)
{
    struct lyxml_elem *iter, *aux;

    if (!elem) {
        return;
    }

    /* optimization - avoid freeing (unlinking) the last node of the siblings list */
    /* so, first, free the node's predecessors to the beginning of the list ... */
    for(iter = elem->prev; iter->next; iter = aux) {
        aux = iter->prev;
        lyxml_free(ctx, iter);
    }
    /* ... then, the node is the first in the siblings list, so free them all */
    LY_TREE_FOR_SAFE(elem, aux, iter) {
        lyxml_free(ctx, iter);
    }
}